

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Track.cpp
# Opt level: O1

int __thiscall Track::data_extent_bytes(Track *this,Sector *sector)

{
  Encoding EVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  EVar1 = sector->encoding;
  if (EVar1 - MFM < 2) {
    iVar2 = data_extent_bits(this,sector);
    iVar2 = iVar2 >> (EVar1 == FM | 4U);
    iVar3 = GetSectorOverhead(sector->encoding);
    iVar4 = GetSyncOverhead(sector->encoding);
    iVar5 = iVar2 - (iVar3 - iVar4);
    if (iVar5 == 0 || iVar2 < iVar3 - iVar4) {
      iVar5 = 0;
    }
    return iVar5;
  }
  iVar5 = Sector::size(sector);
  return iVar5;
}

Assistant:

int Track::data_extent_bytes(const Sector& sector) const
{
    // We only support real data extent for MFM and FM sectors.
    if (sector.encoding != Encoding::MFM && sector.encoding != Encoding::FM)
        return sector.size();

    auto encoding_shift = (sector.encoding == Encoding::FM) ? 5 : 4;
    auto gap_bytes = data_extent_bits(sector) >> encoding_shift;
    auto overhead_bytes = GetSectorOverhead(sector.encoding) - GetSyncOverhead(sector.encoding);
    auto extent_bytes = (gap_bytes > overhead_bytes) ? gap_bytes - overhead_bytes : 0;
    return extent_bytes;
}